

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceId.h
# Opt level: O3

void __thiscall plugin::InterfaceId::InterfaceId(InterfaceId *this,string *name)

{
  pointer pcVar1;
  runtime_error *this_00;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  if (name->_M_string_length != 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid IntefaceId, interface name cannot be empty.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit InterfaceId(const std::string& name)
            : m_name(name)
        {
            if(name.empty())
            {
                throw std::runtime_error("Invalid IntefaceId, interface name cannot be empty.");
            }
        }